

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::skip_bom(lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this)

{
  bool bVar1;
  char_int_type cVar2;
  
  cVar2 = get(this);
  if (cVar2 == 0xef) {
    cVar2 = get(this);
    if (cVar2 == 0xbb) {
      cVar2 = get(this);
      bVar1 = cVar2 == 0xbf;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    unget(this);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool skip_bom()
    {
        if (get() == 0xEF)
        {
            // check if we completely parse the BOM
            return get() == 0xBB && get() == 0xBF;
        }

        // the first character is not the beginning of the BOM; unget it to
        // process is later
        unget();
        return true;
    }